

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

void __thiscall
stackless::
Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
::Frame(Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
        *this,env_p *environment)

{
  this->_vptr_Frame = (_func_int **)&PTR__Frame_00130b48;
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->env).
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>,
             &environment->
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>);
  (this->result).type = Symbol;
  (this->result).val._M_dataplus._M_p = (pointer)&(this->result).val.field_2;
  (this->result).val._M_string_length = 0;
  (this->result).val.field_2._M_local_buf[0] = '\0';
  (this->result).list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result).list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result).list.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result).env.
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->result).env.
  super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Frame(env_p environment) : env(environment) {
		}